

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

uint32_t event_track::find_sample_boundaries
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *sample_boundaries,
                   uint64_t segment_start,uint64_t segment_end)

{
  iterator iVar1;
  pointer puVar2;
  unsigned_long *puVar3;
  long lVar4;
  pointer pDVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint64_t pt;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  local_60 = (void *)segment_end;
  local_58 = (void *)segment_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (sample_boundaries,&local_48);
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  iVar1._M_current =
       (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
               (unsigned_long *)&local_58);
  }
  else {
    *iVar1._M_current = (unsigned_long)local_58;
    (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  if (local_60 != (void *)0x0) {
    iVar1._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
                 (unsigned_long *)&local_60);
    }
    else {
      *iVar1._M_current = (unsigned_long)local_60;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  pDVar5 = (emsgs_in->
           super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((emsgs_in->
      super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      )._M_impl.super__Vector_impl_data._M_finish != pDVar5) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      local_48 = (void *)pDVar5[uVar8].presentation_time_;
      local_50 = (void *)((ulong)pDVar5[uVar8].event_duration_ + pDVar5[uVar8].presentation_time_ +
                         (ulong)((ulong)pDVar5[uVar8].event_duration_ == 0));
      if ((local_58 <= local_48) && (local_48 <= (void *)((long)local_60 - 1U))) {
        iVar1._M_current =
             (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
                     (unsigned_long *)&local_48);
        }
        else {
          *iVar1._M_current = (unsigned_long)local_48;
          (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      if (((local_60 != (void *)0x0) && (local_50 < local_60)) && (local_58 <= local_50)) {
        iVar1._M_current =
             (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
                     (unsigned_long *)&local_50);
        }
        else {
          *iVar1._M_current = (unsigned_long)local_50;
          (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      if (local_60 == (void *)0x0) {
        iVar1._M_current =
             (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
                     (unsigned_long *)&local_50);
        }
        else {
          *iVar1._M_current = (unsigned_long)local_50;
          (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      pDVar5 = (emsgs_in->
               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(emsgs_in->
                     super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar5 >> 3) *
              -0x7b425ed097b425ed;
      bVar10 = uVar9 <= uVar8;
      lVar4 = uVar8 - uVar9;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar10 && lVar4 != 0);
  }
  if (local_60 != (void *)0x0) {
    iVar1._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar1,
                 (unsigned_long *)&local_60);
    }
    else {
      *iVar1._M_current = (unsigned_long)local_60;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  puVar2 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar7) {
    uVar8 = (long)puVar7 - (long)puVar2 >> 3;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar7,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar7);
  }
  _Var6 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((sample_boundaries->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (sample_boundaries->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  puVar3 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var6._M_current != puVar3) &&
     (puVar2 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_finish,
     puVar7 = (pointer)((long)_Var6._M_current + ((long)puVar2 - (long)puVar3)), puVar2 != puVar7))
  {
    (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  if (local_60 == (void *)0x0) {
    iVar1._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_48 = (void *)(iVar1._M_current[-1] + 1);
    if (iVar1._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (sample_boundaries,iVar1,(unsigned_long *)&local_48);
    }
    else {
      *iVar1._M_current = (unsigned_long)local_48;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return (uint32_t)
         ((ulong)((long)(sample_boundaries->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(sample_boundaries->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3);
}

Assistant:

uint32_t event_track::find_sample_boundaries(
	const std::vector<DASHEventMessageBoxv1> &emsgs_in,
	std::vector<uint64_t> &sample_boundaries,
	uint64_t segment_start,
	uint64_t segment_end )
{

	sample_boundaries = std::vector<uint64_t>();
	sample_boundaries.push_back(segment_start);

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	for (uint32_t k = 0; k < emsgs_in.size(); k++)
	{
		uint64_t pt = emsgs_in[k].presentation_time_;
		uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

		if (emsgs_in[k].event_duration_ == 0)
			pt_du += 1;  // set the sample duration to a single tick

						 // boundaries due to events starting
		if (pt >= segment_start)  // event starts  
			if (segment_end == 0 || pt < segment_end)
				sample_boundaries.push_back(pt);

		// boundaries due to event ending
		if (segment_end != 0)
			if (pt_du >= segment_start && pt_du < segment_end)
				sample_boundaries.push_back(pt_du);

		if (segment_end == 0)
			sample_boundaries.push_back(pt_du);
	}

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	sort(sample_boundaries.begin(), sample_boundaries.end());
	sample_boundaries.erase(std::unique(sample_boundaries.begin(),
		sample_boundaries.end()), sample_boundaries.end());

	if (segment_end == 0)
		sample_boundaries.push_back(sample_boundaries[sample_boundaries.size() - 1] + 1);

	return (uint32_t)sample_boundaries.size();
}